

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O0

Aig_Man_t *
Saig_ManCexRefine(Aig_Man_t *p,Aig_Man_t *pAbs,Vec_Int_t *vFlops,int nFrames,int nConfMaxOne,
                 int fUseBdds,int fUseDprove,int fVerbose,int *pnUseStart,int *piRetValue,
                 int *pnFrames)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Abc_Cex_t *pAVar4;
  int local_15c;
  Saig_ParBbr_t *pPars_1;
  Saig_ParBbr_t Pars_1;
  Pdr_Par_t *pPars;
  Pdr_Par_t Pars;
  Aig_Man_t *pAbsOrpos;
  int RetValue;
  int Entry;
  int i;
  Vec_Int_t *vFlopsNew;
  int fUseBdds_local;
  int nConfMaxOne_local;
  int nFrames_local;
  Vec_Int_t *vFlops_local;
  Aig_Man_t *pAbs_local;
  Aig_Man_t *p_local;
  
  *piRetValue = -1;
  if ((fUseDprove == 0) || (iVar1 = Aig_ManRegNum(pAbs), iVar1 < 1)) {
    if ((fUseBdds == 0) ||
       ((iVar1 = Aig_ManRegNum(pAbs), iVar1 < 1 || (iVar1 = Aig_ManRegNum(pAbs), 0x50 < iVar1)))) {
      if (pnUseStart == (int *)0x0) {
        local_15c = 0;
      }
      else {
        local_15c = *pnUseStart;
      }
      Saig_BmcPerform(pAbs,local_15c,nFrames,2000,0,nConfMaxOne,0,fVerbose,0,pnFrames,0,0);
    }
    else {
      Bbr_ManSetDefaultParams((Saig_ParBbr_t *)&pPars_1);
      pPars_1._0_4_ = 0;
      pPars_1._4_4_ = 1000000;
      Pars_1.nBddMax = 1;
      Pars_1.nIterMax = 1;
      Pars_1.fPartition = 1;
      Pars_1.fReorder = fVerbose;
      Pars_1.fReorderImage = 0;
      Pars_1.TimeLimit = nFrames;
      iVar1 = Aig_ManVerifyUsingBdds(pAbs,(Saig_ParBbr_t *)&pPars_1);
      if (iVar1 != 0) {
        *piRetValue = 1;
      }
    }
  }
  else {
    Pars.pInvFileName = (char *)Saig_ManDupOrpos(pAbs);
    Pars_1._32_8_ = &pPars;
    Pdr_ManSetDefaultParams((Pdr_Par_t *)Pars_1._32_8_);
    *(undefined4 *)(Pars_1._32_8_ + 0x14) = 10;
    *(int *)(Pars_1._32_8_ + 100) = fVerbose;
    if (*(int *)(Pars_1._32_8_ + 100) != 0) {
      printf("Running property directed reachability...\n");
    }
    iVar1 = Pdr_ManSolve((Aig_Man_t *)Pars.pInvFileName,(Pdr_Par_t *)Pars_1._32_8_);
    if (*(long *)(Pars.pInvFileName + 0x198) != 0) {
      iVar2 = Saig_ManFindFailedPoCex(pAbs,*(Abc_Cex_t **)(Pars.pInvFileName + 0x198));
      **(int **)(Pars.pInvFileName + 0x198) = iVar2;
    }
    pAbs->pSeqModel = *(Abc_Cex_t **)(Pars.pInvFileName + 0x198);
    Pars.pInvFileName[0x198] = '\0';
    Pars.pInvFileName[0x199] = '\0';
    Pars.pInvFileName[0x19a] = '\0';
    Pars.pInvFileName[0x19b] = '\0';
    Pars.pInvFileName[0x19c] = '\0';
    Pars.pInvFileName[0x19d] = '\0';
    Pars.pInvFileName[0x19e] = '\0';
    Pars.pInvFileName[0x19f] = '\0';
    Aig_ManStop((Aig_Man_t *)Pars.pInvFileName);
    if (iVar1 != 0) {
      *piRetValue = 1;
    }
  }
  if (pAbs->pSeqModel == (Abc_Cex_t *)0x0) {
    p_local = (Aig_Man_t *)0x0;
  }
  else {
    if (pnUseStart != (int *)0x0) {
      *pnUseStart = pAbs->pSeqModel->iFrame;
    }
    iVar1 = Saig_ManCexFirstFlopPi(p,pAbs);
    p_00 = Saig_ManExtendCounterExampleTest3(pAbs,iVar1,pAbs->pSeqModel,fVerbose);
    if (p_00 == (Vec_Int_t *)0x0) {
      p_local = (Aig_Man_t *)0x0;
    }
    else {
      iVar1 = Vec_IntSize(p_00);
      if (iVar1 == 0) {
        printf("Discovered a true counter-example!\n");
        pAVar4 = Saig_ManCexRemap(p,pAbs,pAbs->pSeqModel);
        p->pSeqModel = pAVar4;
        Vec_IntFree(p_00);
        *piRetValue = 0;
        p_local = (Aig_Man_t *)0x0;
      }
      else {
        if (fVerbose != 0) {
          uVar3 = Vec_IntSize(p_00);
          iVar1 = Aig_ManRegNum(pAbs);
          iVar2 = Vec_IntSize(p_00);
          printf("Adding %d registers to the abstraction (total = %d).\n\n",(ulong)uVar3,
                 (ulong)(uint)(iVar1 + iVar2));
        }
        for (RetValue = 0; iVar1 = Vec_IntSize(p_00), RetValue < iVar1; RetValue = RetValue + 1) {
          iVar1 = Vec_IntEntry(p_00,RetValue);
          iVar1 = Vec_IntEntry(pAbs->vCiNumsOrig,iVar1);
          iVar2 = Saig_ManPiNum(p);
          if (iVar1 < iVar2) {
            __assert_fail("Entry >= Saig_ManPiNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                          ,0xe7,
                          "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                         );
          }
          iVar2 = Aig_ManCiNum(p);
          if (iVar2 <= iVar1) {
            __assert_fail("Entry < Aig_ManCiNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                          ,0xe8,
                          "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                         );
          }
          iVar2 = Saig_ManPiNum(p);
          Vec_IntPush(vFlops,iVar1 - iVar2);
        }
        Vec_IntFree(p_00);
        Vec_IntSort(vFlops,0);
        for (RetValue = 1; iVar1 = Vec_IntSize(vFlops), RetValue < iVar1; RetValue = RetValue + 1) {
          iVar1 = Vec_IntEntry(vFlops,RetValue);
          iVar2 = Vec_IntEntry(vFlops,RetValue + -1);
          if (iVar2 == iVar1) {
            __assert_fail("Vec_IntEntry(vFlops, i-1) != Entry",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldRef.c"
                          ,0xef,
                          "Aig_Man_t *Saig_ManCexRefine(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int *, int *, int *)"
                         );
          }
        }
        p_local = Saig_ManDupAbstraction(p,vFlops);
      }
    }
  }
  return p_local;
}

Assistant:

Aig_Man_t * Saig_ManCexRefine( Aig_Man_t * p, Aig_Man_t * pAbs, Vec_Int_t * vFlops, int nFrames, int nConfMaxOne, int fUseBdds, int fUseDprove, int fVerbose, int * pnUseStart, int * piRetValue, int * pnFrames )
{ 
    Vec_Int_t * vFlopsNew;
    int i, Entry, RetValue;
    *piRetValue = -1;
    if ( fUseDprove && Aig_ManRegNum(pAbs) > 0 )
    {
/*
        Fra_Sec_t SecPar, * pSecPar = &SecPar;
        Fra_SecSetDefaultParams( pSecPar );
        pSecPar->fVerbose       = fVerbose;
        RetValue = Fra_FraigSec( pAbs, pSecPar, NULL );
*/
        Aig_Man_t * pAbsOrpos = Saig_ManDupOrpos( pAbs );
        Pdr_Par_t Pars, * pPars = &Pars;
        Pdr_ManSetDefaultParams( pPars );
        pPars->nTimeOut = 10;
        pPars->fVerbose = fVerbose;
        if ( pPars->fVerbose )
            printf( "Running property directed reachability...\n" );
        RetValue = Pdr_ManSolve( pAbsOrpos, pPars );
        if ( pAbsOrpos->pSeqModel )
            pAbsOrpos->pSeqModel->iPo = Saig_ManFindFailedPoCex( pAbs, pAbsOrpos->pSeqModel );
        pAbs->pSeqModel = pAbsOrpos->pSeqModel;
        pAbsOrpos->pSeqModel = NULL;
        Aig_ManStop( pAbsOrpos );
        if ( RetValue )
            *piRetValue = 1;

    }
    else if ( fUseBdds && (Aig_ManRegNum(pAbs) > 0 && Aig_ManRegNum(pAbs) <= 80) )
    {
        Saig_ParBbr_t Pars, * pPars = &Pars;
        Bbr_ManSetDefaultParams( pPars );
        pPars->TimeLimit     = 0;
        pPars->nBddMax       = 1000000;
        pPars->nIterMax      = nFrames;
        pPars->fPartition    = 1;
        pPars->fReorder      = 1;
        pPars->fReorderImage = 1;
        pPars->fVerbose      = fVerbose;
        pPars->fSilent       = 0;
        RetValue = Aig_ManVerifyUsingBdds( pAbs, pPars );
        if ( RetValue )
            *piRetValue = 1;
    }
    else 
    {
        Saig_BmcPerform( pAbs, pnUseStart? *pnUseStart: 0, nFrames, 2000, 0, nConfMaxOne, 0, fVerbose, 0, pnFrames, 0, 0 );
    }
    if ( pAbs->pSeqModel == NULL )
        return NULL;
    if ( pnUseStart )
        *pnUseStart = pAbs->pSeqModel->iFrame;
//    vFlopsNew = Saig_ManExtendCounterExampleTest( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pAbs->pSeqModel, 1, fVerbose );
    vFlopsNew = Saig_ManExtendCounterExampleTest3( pAbs, Saig_ManCexFirstFlopPi(p, pAbs), pAbs->pSeqModel, fVerbose );
    if ( vFlopsNew == NULL )
        return NULL;
    if ( Vec_IntSize(vFlopsNew) == 0 )
    {
        printf( "Discovered a true counter-example!\n" );
        p->pSeqModel = Saig_ManCexRemap( p, pAbs, pAbs->pSeqModel );
        Vec_IntFree( vFlopsNew );
        *piRetValue = 0;
        return NULL;
    }
    // vFlopsNew contains PI numbers that should be kept in pAbs
    if ( fVerbose )
        printf( "Adding %d registers to the abstraction (total = %d).\n\n", Vec_IntSize(vFlopsNew), Aig_ManRegNum(pAbs)+Vec_IntSize(vFlopsNew) );
    // add to the abstraction
    Vec_IntForEachEntry( vFlopsNew, Entry, i )
    {
        Entry = Vec_IntEntry(pAbs->vCiNumsOrig, Entry);
        assert( Entry >= Saig_ManPiNum(p) );
        assert( Entry < Aig_ManCiNum(p) );
        Vec_IntPush( vFlops, Entry-Saig_ManPiNum(p) );
    }
    Vec_IntFree( vFlopsNew );

    Vec_IntSort( vFlops, 0 );
    Vec_IntForEachEntryStart( vFlops, Entry, i, 1 )
        assert( Vec_IntEntry(vFlops, i-1) != Entry );

    return Saig_ManDupAbstraction( p, vFlops );
}